

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_Plugin_TransitiveDeprecatedFeature_Test::
~CommandLineInterfaceTest_Plugin_TransitiveDeprecatedFeature_Test
          (CommandLineInterfaceTest_Plugin_TransitiveDeprecatedFeature_Test *this)

{
  CommandLineInterfaceTester::~CommandLineInterfaceTester((CommandLineInterfaceTester *)this);
  operator_delete(this,0x2e8);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, Plugin_TransitiveDeprecatedFeature) {
  CreateTempFile("google/protobuf/descriptor.proto",
                 google::protobuf::DescriptorProto::descriptor()->file()->DebugString());
  CreateTempFile("google/protobuf/unittest_features.proto",
                 pb::TestFeatures::descriptor()->file()->DebugString());
  CreateTempFile("unused.proto",
                 R"schema(
    edition = "2023";
    import "google/protobuf/unittest_features.proto";
    package foo;
    option features.(pb.test).removed_feature = VALUE9;
    message Foo {}
  )schema");
  CreateTempFile("foo.proto",
                 R"schema(
    edition = "2023";
    import "unused.proto";
    package foo;
    message Bar {
      Foo foo = 1;
    }
  )schema");

  Run("protocol_compiler --test_out=$tmpdir "
      "--proto_path=$tmpdir foo.proto");
  ExpectNoErrors();
}